

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O3

void __thiscall QTextEditPrivate::~QTextEditPrivate(QTextEditPrivate *this)

{
  Data *pDVar1;
  long lVar2;
  
  *(undefined ***)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
       = &PTR__QTextEditPrivate_007fcc18;
  lVar2 = 0x360;
  do {
    QObject::disconnect((Connection *)
                        (&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                          super_QWidgetPrivate.super_QObjectPrivate + lVar2));
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x3c8);
  lVar2 = 0x3c0;
  do {
    QMetaObject::Connection::~Connection
              ((Connection *)
               (&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
                 super_QObjectPrivate + lVar2));
    lVar2 = lVar2 + -8;
  } while (lVar2 != 0x358);
  pDVar1 = (this->placeholderText).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->placeholderText).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->anchorToScrollToWhenVisible).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->anchorToScrollToWhenVisible).d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((this->autoScrollTimer).m_id != Invalid) {
    QBasicTimer::stop();
  }
  QAbstractScrollAreaPrivate::~QAbstractScrollAreaPrivate(&this->super_QAbstractScrollAreaPrivate);
  return;
}

Assistant:

QTextEditPrivate::~QTextEditPrivate()
{
    for (const QMetaObject::Connection &connection : connections)
        QObject::disconnect(connection);
}